

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

int stbi__bmp_info(stbi__context *s,int *x,int *y,int *comp)

{
  int iVar1;
  undefined1 local_58 [8];
  stbi__bmp_data info;
  void *p;
  int *comp_local;
  int *y_local;
  int *x_local;
  stbi__context *s_local;
  
  info.mb = 0xff;
  info._24_8_ = stbi__bmp_parse_header(s,(stbi__bmp_data *)local_58);
  stbi__rewind(s);
  if (info._24_8_ == 0) {
    s_local._4_4_ = 0;
  }
  else {
    if (x != (int *)0x0) {
      *x = s->img_x;
    }
    if (y != (int *)0x0) {
      *y = s->img_y;
    }
    if (comp != (int *)0x0) {
      if ((local_58._0_4_ == 0x18) && (info.mg == 0xff000000)) {
        *comp = 3;
      }
      else {
        iVar1 = 3;
        if (info.mg != 0) {
          iVar1 = 4;
        }
        *comp = iVar1;
      }
    }
    s_local._4_4_ = 1;
  }
  return s_local._4_4_;
}

Assistant:

static int stbi__bmp_info(stbi__context *s, int *x, int *y, int *comp)
{
   void *p;
   stbi__bmp_data info;

   info.all_a = 255;
   p = stbi__bmp_parse_header(s, &info);
   stbi__rewind( s );
   if (p == NULL)
      return 0;
   if (x) *x = s->img_x;
   if (y) *y = s->img_y;
   if (comp) {
      if (info.bpp == 24 && info.ma == 0xff000000)
         *comp = 3;
      else
         *comp = info.ma ? 4 : 3;
   }
   return 1;
}